

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataRefs.cpp
# Opt level: O3

string * __thiscall
DataRefs::GetXPSimTimeStr_abi_cxx11_(string *__return_storage_ptr__,DataRefs *this)

{
  size_t sVar1;
  time_t xp_t;
  char s [100];
  tm xp_tm;
  long local_c0;
  char local_b8 [104];
  tm local_50;
  
  local_c0 = this->lastXPSimTime_ms / 1000;
  gmtime_r(&local_c0,&local_50);
  strftime(local_b8,100,"%Y-%m-%d %H:%M:%S UTC",&local_50);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  sVar1 = strlen(local_b8);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,local_b8,local_b8 + sVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string DataRefs::GetXPSimTimeStr() const
{
    char s[100];
    time_t xp_t = time_t(lastXPSimTime_ms / 1000L);
    struct tm xp_tm;
    gmtime_s(&xp_tm, &xp_t);
    std::strftime(s, sizeof(s), "%Y-%m-%d %H:%M:%S UTC", &xp_tm);
    return s;
}